

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorRcc.cxx
# Opt level: O2

bool __thiscall cmQtAutoGeneratorRcc::GenerateRcc(cmQtAutoGeneratorRcc *this)

{
  ProcessResultT *this_00;
  ReadOnlyProcessT *pRVar1;
  bool bVar2;
  bool bVar3;
  string emsg;
  string local_40;
  
  bVar3 = true;
  if (this->Generate_ == true) {
    pRVar1 = (this->Process_)._M_t.
             super___uniq_ptr_impl<cmQtAutoGenerator::ReadOnlyProcessT,_std::default_delete<cmQtAutoGenerator::ReadOnlyProcessT>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmQtAutoGenerator::ReadOnlyProcessT_*,_std::default_delete<cmQtAutoGenerator::ReadOnlyProcessT>_>
             .super__Head_base<0UL,_cmQtAutoGenerator::ReadOnlyProcessT_*,_false>._M_head_impl;
    if (pRVar1 == (ReadOnlyProcessT *)0x0) {
      emsg._M_dataplus._M_p = (pointer)0x0;
      emsg._M_string_length = 0;
      emsg.field_2._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&emsg,&this->RccExecutable_);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&emsg,
                 (const_iterator)emsg._M_string_length,
                 (this->Options_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (this->Options_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&emsg,
                 (char (*) [3])"-o");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&emsg,&this->RccFileOutput_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&emsg,&this->QrcFile_);
      bVar3 = StartProcess(this,&this->AutogenBuildDir_,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&emsg,true);
      bVar3 = !bVar3;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&emsg);
    }
    else if (pRVar1->IsFinished_ == true) {
      this_00 = &this->ProcessResult_;
      bVar2 = cmQtAutoGenerator::ProcessResultT::error(this_00);
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&emsg,"The rcc process failed to compile\n  ",
                   (allocator<char> *)&local_40);
        cmQtAutoGen::Quoted(&local_40,&this->QrcFile_);
        std::__cxx11::string::append((string *)&emsg);
        std::__cxx11::string::~string((string *)&local_40);
        std::__cxx11::string::append((char *)&emsg);
        cmQtAutoGen::Quoted(&local_40,&this->RccFileOutput_);
        std::__cxx11::string::append((string *)&emsg);
        std::__cxx11::string::~string((string *)&local_40);
        bVar2 = cmQtAutoGenerator::ProcessResultT::error(this_00);
        if (bVar2) {
          std::__cxx11::string::append((char *)&emsg);
          std::__cxx11::string::append((string *)&emsg);
        }
        cmQtAutoGenerator::Logger::ErrorCommand
                  (&(this->super_cmQtAutoGenerator).Logger_,RCC,&emsg,
                   &(((this->Process_)._M_t.
                      super___uniq_ptr_impl<cmQtAutoGenerator::ReadOnlyProcessT,_std::default_delete<cmQtAutoGenerator::ReadOnlyProcessT>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmQtAutoGenerator::ReadOnlyProcessT_*,_std::default_delete<cmQtAutoGenerator::ReadOnlyProcessT>_>
                      .super__Head_base<0UL,_cmQtAutoGenerator::ReadOnlyProcessT_*,_false>.
                     _M_head_impl)->Setup_).Command,&(this->ProcessResult_).StdOut);
        std::__cxx11::string::~string((string *)&emsg);
        cmQtAutoGenerator::FileSystem::FileRemove
                  (&(this->super_cmQtAutoGenerator).FileSys_,&this->RccFileOutput_);
        this->Error_ = true;
      }
      else {
        if ((this->ProcessResult_).StdOut._M_string_length != 0) {
          cmQtAutoGenerator::Logger::Info
                    (&(this->super_cmQtAutoGenerator).Logger_,RCC,&(this->ProcessResult_).StdOut);
        }
        this->BuildFileChanged_ = true;
      }
      std::
      __uniq_ptr_impl<cmQtAutoGenerator::ReadOnlyProcessT,_std::default_delete<cmQtAutoGenerator::ReadOnlyProcessT>_>
      ::reset((__uniq_ptr_impl<cmQtAutoGenerator::ReadOnlyProcessT,_std::default_delete<cmQtAutoGenerator::ReadOnlyProcessT>_>
               *)&this->Process_,(pointer)0x0);
      cmQtAutoGenerator::ProcessResultT::reset(this_00);
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool cmQtAutoGeneratorRcc::GenerateRcc()
{
  if (!Generate_) {
    // Nothing to do
    return true;
  }

  if (Process_) {
    // Process is running already
    if (Process_->IsFinished()) {
      // Process is finished
      if (!ProcessResult_.error()) {
        // Rcc process success
        // Print rcc output
        if (!ProcessResult_.StdOut.empty()) {
          Log().Info(GenT::RCC, ProcessResult_.StdOut);
        }
        BuildFileChanged_ = true;
      } else {
        // Rcc process failed
        {
          std::string emsg = "The rcc process failed to compile\n  ";
          emsg += Quoted(QrcFile_);
          emsg += "\ninto\n  ";
          emsg += Quoted(RccFileOutput_);
          if (ProcessResult_.error()) {
            emsg += "\n";
            emsg += ProcessResult_.ErrorMessage;
          }
          Log().ErrorCommand(GenT::RCC, emsg, Process_->Setup().Command,
                             ProcessResult_.StdOut);
        }
        FileSys().FileRemove(RccFileOutput_);
        Error_ = true;
      }
      // Clean up
      Process_.reset();
      ProcessResult_.reset();
    } else {
      // Process is not finished, yet.
      return false;
    }
  } else {
    // Start a rcc process
    std::vector<std::string> cmd;
    cmd.push_back(RccExecutable_);
    cmd.insert(cmd.end(), Options_.begin(), Options_.end());
    cmd.emplace_back("-o");
    cmd.push_back(RccFileOutput_);
    cmd.push_back(QrcFile_);
    // We're done here if the process fails to start
    return !StartProcess(AutogenBuildDir_, cmd, true);
  }

  return true;
}